

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

bool __thiscall cfd::core::ByteData256::IsEmpty(ByteData256 *this)

{
  pointer puVar1;
  pointer puVar2;
  value_type_conflict *__val;
  undefined1 (*pauVar3) [16];
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pauVar3 = (undefined1 (*) [16])operator_new(0x20);
  *pauVar3 = (undefined1  [16])0x0;
  pauVar3[1] = (undefined1  [16])0x0;
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar2 - (long)puVar1 == 0x20) {
    if (puVar2 == puVar1) {
      bVar4 = true;
    }
    else {
      auVar6[0] = -((*pauVar3)[0] == *puVar1);
      auVar6[1] = -((*pauVar3)[1] == puVar1[1]);
      auVar6[2] = -((*pauVar3)[2] == puVar1[2]);
      auVar6[3] = -((*pauVar3)[3] == puVar1[3]);
      auVar6[4] = -((*pauVar3)[4] == puVar1[4]);
      auVar6[5] = -((*pauVar3)[5] == puVar1[5]);
      auVar6[6] = -((*pauVar3)[6] == puVar1[6]);
      auVar6[7] = -((*pauVar3)[7] == puVar1[7]);
      auVar6[8] = -((*pauVar3)[8] == puVar1[8]);
      auVar6[9] = -((*pauVar3)[9] == puVar1[9]);
      auVar6[10] = -((*pauVar3)[10] == puVar1[10]);
      auVar6[0xb] = -((*pauVar3)[0xb] == puVar1[0xb]);
      auVar6[0xc] = -((*pauVar3)[0xc] == puVar1[0xc]);
      auVar6[0xd] = -((*pauVar3)[0xd] == puVar1[0xd]);
      auVar6[0xe] = -((*pauVar3)[0xe] == puVar1[0xe]);
      auVar6[0xf] = -((*pauVar3)[0xf] == puVar1[0xf]);
      auVar5[0] = -(pauVar3[1][0] == puVar1[0x10]);
      auVar5[1] = -(pauVar3[1][1] == puVar1[0x11]);
      auVar5[2] = -(pauVar3[1][2] == puVar1[0x12]);
      auVar5[3] = -(pauVar3[1][3] == puVar1[0x13]);
      auVar5[4] = -(pauVar3[1][4] == puVar1[0x14]);
      auVar5[5] = -(pauVar3[1][5] == puVar1[0x15]);
      auVar5[6] = -(pauVar3[1][6] == puVar1[0x16]);
      auVar5[7] = -(pauVar3[1][7] == puVar1[0x17]);
      auVar5[8] = -(pauVar3[1][8] == puVar1[0x18]);
      auVar5[9] = -(pauVar3[1][9] == puVar1[0x19]);
      auVar5[10] = -(pauVar3[1][10] == puVar1[0x1a]);
      auVar5[0xb] = -(pauVar3[1][0xb] == puVar1[0x1b]);
      auVar5[0xc] = -(pauVar3[1][0xc] == puVar1[0x1c]);
      auVar5[0xd] = -(pauVar3[1][0xd] == puVar1[0x1d]);
      auVar5[0xe] = -(pauVar3[1][0xe] == puVar1[0x1e]);
      auVar5[0xf] = -(pauVar3[1][0xf] == puVar1[0x1f]);
      auVar5 = auVar5 & auVar6;
      bVar4 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff;
    }
  }
  else {
    bVar4 = false;
  }
  operator_delete(pauVar3);
  return bVar4;
}

Assistant:

bool ByteData256::IsEmpty() const {
  std::vector<uint8_t> data(kByteData256Length);
  memset(data.data(), 0, data.size());
  return data_ == data;
}